

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O0

sat_solver * Pdr_ManFetchSolver(Pdr_Man_t *p,int k)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Pdr_Set_t *pCube_00;
  int local_40;
  int local_3c;
  int j;
  int i;
  Pdr_Set_t *pCube;
  Vec_Ptr_t *vArrayK;
  sat_solver *pSat;
  int k_local;
  Pdr_Man_t *p_local;
  
  p_local = (Pdr_Man_t *)Pdr_ManSolver(p,k);
  iVar1 = Vec_IntEntry(p->vActVars,k);
  if (p->pPars->nRecycle <= iVar1) {
    iVar1 = Vec_PtrSize(p->vSolvers);
    if (iVar1 + -1 <= k) {
      __assert_fail("k < Vec_PtrSize(p->vSolvers) - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                    ,0x56,"sat_solver *Pdr_ManFetchSolver(Pdr_Man_t *, int)");
    }
    p->nStarts = p->nStarts + 1;
    zsat_solver_restart_seed((sat_solver *)p_local,(double)p->pPars->nRandomSeed);
    p_local = (Pdr_Man_t *)Pdr_ManNewSolver((sat_solver *)p_local,p,k,(uint)(k == 0));
    Vec_PtrWriteEntry(p->vSolvers,k,p_local);
    Vec_IntWriteEntry(p->vActVars,k,0);
    Pdr_ManSetPropertyOutput(p,k);
    for (local_3c = k; iVar1 = Vec_VecSize(p->vClauses), local_3c < iVar1; local_3c = local_3c + 1)
    {
      p_00 = Vec_VecEntry(p->vClauses,local_3c);
      for (local_40 = 0; iVar1 = Vec_PtrSize(p_00), local_40 < iVar1; local_40 = local_40 + 1) {
        pCube_00 = (Pdr_Set_t *)Vec_PtrEntry(p_00,local_40);
        Pdr_ManSolverAddClause(p,k,pCube_00);
      }
    }
  }
  return (sat_solver *)p_local;
}

Assistant:

sat_solver * Pdr_ManFetchSolver( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;
    pSat = Pdr_ManSolver(p, k);
    if ( Vec_IntEntry(p->vActVars, k) < p->pPars->nRecycle )
        return pSat;
    assert( k < Vec_PtrSize(p->vSolvers) - 1 );
    p->nStarts++;
//    sat_solver_delete( pSat );
//    pSat = sat_solver_new();
//    sat_solver_restart( pSat );
    zsat_solver_restart_seed( pSat, p->pPars->nRandomSeed );
    // create new SAT solver
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    // write new SAT solver
    Vec_PtrWriteEntry( p->vSolvers, k, pSat );
    Vec_IntWriteEntry( p->vActVars, k, 0 );
    // set the property output
    Pdr_ManSetPropertyOutput( p, k );
    // add the clauses
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, k )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
            Pdr_ManSolverAddClause( p, k, pCube );
    return pSat;
}